

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Abc_InfoRandomBytes(uint *p,int nWords)

{
  uint uVar1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(uint)nWords; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar1 = rand();
    p[uVar2 - 1] = -(uint)((uVar1 & 8) == 8) & 0xff | -(uint)((uVar1 & 2) == 2) & 0xff0000 |
                   -(uint)((uVar1 & 4) == 4) & 0xff00 | -(uint)((uVar1 & 1) == 1) & 0xff000000;
  }
  return;
}

Assistant:

void Abc_InfoRandomBytes( unsigned * p, int nWords ) 
{ 
    int i, Num; 
    for ( i = nWords - 1; i >= 0; i-- ) 
    { 
        Num = rand(); 
        p[i] = (Num & 1)? 0xff : 0;
        p[i] = (p[i] << 8) | ((Num & 2)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 4)? 0xff : 0);
        p[i] = (p[i] << 8) | ((Num & 8)? 0xff : 0);
    } 
//    Extra_PrintBinary( stdout, p, 32 ); printf( "\n" );
}